

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civil_time_detail.h
# Opt level: O1

civil_day __thiscall
absl::lts_20240722::time_internal::cctz::detail::next_weekday(detail *this,civil_day cd,weekday wd)

{
  int iVar1;
  unkuint10 Var2;
  int *piVar3;
  int *piVar4;
  long lVar5;
  char m;
  ulong uVar6;
  fields fVar7;
  civil_day cVar8;
  
  m = (char)cd.f_.y;
  uVar6 = ((long)this % 400 - (ulong)(m < '\x03')) + 0x960;
  piVar3 = &DAT_00113360;
  do {
    piVar4 = piVar3 + 1;
    iVar1 = *piVar3;
    piVar3 = piVar4;
  } while (*(int *)(&DAT_00113238 +
                   ((long)(uVar6 / 400 + (uVar6 >> 2) +
                           (long)cd.f_.y._1_1_ + (long)*(int *)(&DAT_00113260 + (long)m * 4) +
                          (uVar6 - (uVar6 >> 2) / 0x19)) % 7) * 4) != iVar1);
  lVar5 = 0;
  do {
    lVar5 = lVar5 + 0x100000000;
    iVar1 = *piVar4;
    piVar4 = piVar4 + 1;
  } while (iVar1 != cd.f_._8_4_);
  fVar7 = impl::n_day((year_t)this,m,(long)cd.f_.y._1_1_,lVar5 >> 0x20,cd.f_.y._2_1_,cd.f_.y._3_1_,
                      cd.f_.y._4_1_);
  Var2 = fVar7._0_10_;
  cVar8.f_.hh = '\0';
  cVar8.f_.mm = '\0';
  cVar8.f_.ss = '\0';
  cVar8.f_._13_3_ = 0;
  cVar8.f_.y = (long)Var2;
  cVar8.f_.m = (char)(Var2 >> 0x40);
  cVar8.f_.d = (char)(Var2 >> 0x48);
  return (civil_day)cVar8.f_;
}

Assistant:

CONSTEXPR_F civil_day next_weekday(civil_day cd, weekday wd) noexcept {
  CONSTEXPR_D weekday k_weekdays_forw[14] = {
      weekday::monday,    weekday::tuesday,  weekday::wednesday,
      weekday::thursday,  weekday::friday,   weekday::saturday,
      weekday::sunday,    weekday::monday,   weekday::tuesday,
      weekday::wednesday, weekday::thursday, weekday::friday,
      weekday::saturday,  weekday::sunday,
  };
  weekday base = get_weekday(cd);
  for (int i = 0;; ++i) {
    if (base == k_weekdays_forw[i]) {
      for (int j = i + 1;; ++j) {
        if (wd == k_weekdays_forw[j]) {
          return cd + (j - i);
        }
      }
    }
  }
}